

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TtCofactorTest10(word *pTruth,int nVars,int N)

{
  int iVar1;
  int iVar2;
  int nWords;
  int jVar;
  
  jVar = 1;
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  iVar1 = 1;
  if (1 < nVars) {
    iVar1 = nVars;
  }
  do {
    if (iVar1 == jVar) {
      return;
    }
    Abc_TtCopy(Abc_TtCofactorTest10::pCopy1,pTruth,nWords,0);
    Abc_TtSwapAdjacent(Abc_TtCofactorTest10::pCopy1,nWords,jVar + -1);
    Abc_TtCopy(Abc_TtCofactorTest10::pCopy2,pTruth,nWords,0);
    Abc_TtSwapVars(Abc_TtCofactorTest10::pCopy2,nVars,jVar + -1,jVar);
    iVar2 = Abc_TtEqual(Abc_TtCofactorTest10::pCopy1,Abc_TtCofactorTest10::pCopy2,nWords);
    jVar = jVar + 1;
  } while (iVar2 != 0);
  __assert_fail("Abc_TtEqual( pCopy1, pCopy2, nWords )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                ,0x2d0,"void Abc_TtCofactorTest10(word *, int, int)");
}

Assistant:

void Abc_TtCofactorTest10( word * pTruth, int nVars, int N )
{
    static word pCopy1[1024];
    static word pCopy2[1024];
    int nWords = Abc_TtWordNum( nVars );
    int i;
    for ( i = 0; i < nVars - 1; i++ )
    {
//        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy1, nWords, i );
//        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
        Abc_TtSwapVars( pCopy2, nVars, i, i+1 );
//        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        assert( Abc_TtEqual( pCopy1, pCopy2, nWords ) );
    }
}